

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketnonblocking.cpp
# Opt level: O2

ssize_t __thiscall
hbm::SocketNonblocking::sendBlock(SocketNonblocking *this,void *pBlock,size_t size,bool more)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  undefined7 in_register_00000009;
  size_t local_50;
  void *local_48;
  pollfd pfd;
  
  pfd.fd = this->m_fd;
  pfd.events = 4;
  local_50 = size;
  local_48 = pBlock;
LAB_0011be2c:
  do {
    while( true ) {
      if (size == 0) {
        return local_50;
      }
      sVar2 = send(this->m_fd,local_48,size,(int)CONCAT71(in_register_00000009,more) << 0xf);
      if (sVar2 < 1) break;
      local_48 = (void *)((long)local_48 + sVar2);
      size = size - sVar2;
    }
    if ((sVar2 != 0) && (piVar3 = __errno_location(), *piVar3 == 0xb)) {
      do {
        iVar1 = poll((pollfd *)&pfd,1,-1);
        if (iVar1 != -1) {
          if (iVar1 == 1) goto LAB_0011be2c;
          break;
        }
      } while (*piVar3 == 4);
    }
    size = 0;
    local_50 = 0xffffffffffffffff;
  } while( true );
}

Assistant:

ssize_t hbm::SocketNonblocking::sendBlock(const void* pBlock, size_t size, bool more)
{
	const uint8_t* pDat = reinterpret_cast<const uint8_t*>(pBlock);
	size_t BytesLeft = size;
	ssize_t numBytes;
	ssize_t retVal = size;

	struct pollfd pfd;
	pfd.fd = m_fd;
	pfd.events = POLLOUT;

	int flags = 0;
	if(more) {
		flags |= MSG_MORE;
	}
	int err;

	while (BytesLeft > 0) {
		numBytes = send(m_fd, pDat, BytesLeft, flags);
		if(numBytes>0) {
			pDat += numBytes;
			BytesLeft -= numBytes;
		} else if(numBytes==0) {
			// connection lost...
			BytesLeft = 0;
			retVal = -1;
		} else {
			// <0
			if(errno==EWOULDBLOCK || errno==EAGAIN) {
				// wait for socket to become writable.
				do {
					err = poll(&pfd, 1, -1);
				} while((err==-1) && (errno==EINTR));
				if(err!=1) {
					BytesLeft = 0;
					retVal = -1;
				}
			} else {
				// a real error happened!
				BytesLeft = 0;
				retVal = -1;
			}
		}
	}
	return retVal;
}